

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_t.cpp
# Opt level: O1

string * __thiscall deci::number_t::ToText_abi_cxx11_(string *__return_storage_ptr__,number_t *this)

{
  size_t sVar1;
  char buffer [64];
  char acStack_58 [72];
  
  snprintf(acStack_58,0x40,"%.*g",this->val,0x15);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(acStack_58);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,acStack_58,acStack_58 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string number_t::ToText() const {
    char buffer[64];
    snprintf(buffer, sizeof(buffer), "%.*g", DECIMAL_DIG, this->val);
    return std::string(buffer);
  }